

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::ParseableFunctionInfo::SetCachedSourceString
          (ParseableFunctionInfo *this,JavascriptString *sourceString)

{
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  JavascriptString *pJVar3;
  undefined4 *puVar4;
  RecyclerWeakReferenceBase *weakRef;
  
  pJVar3 = GetCachedSourceString(this);
  if (pJVar3 != (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x7c8,"(this->GetCachedSourceString() == nullptr)",
                                "this->GetCachedSourceString() == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (sourceString != (JavascriptString *)0x0) {
    recycler = ((this->super_FunctionProxy).m_scriptContext)->recycler;
    weakRef = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                        (&recycler->weakReferenceMap,(char *)sourceString,recycler);
    if (weakRef->typeInfo == (Type)0x0) {
      weakRef->typeInfo = (Type)&JavascriptString::typeinfo;
      Memory::Recycler::TrackAllocWeakRef(recycler,weakRef);
    }
    SetCachedSourceStringWeakRef(this,(RecyclerWeakReference<Js::JavascriptString> *)weakRef);
    return;
  }
  return;
}

Assistant:

void ParseableFunctionInfo::SetCachedSourceString(JavascriptString * sourceString)
    {
        Assert(this->GetCachedSourceString() == nullptr);
        if (sourceString)
        {
            this->SetCachedSourceStringWeakRef(this->GetRecycler()->CreateWeakReferenceHandle(sourceString));
        }
    }